

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

float rr::advblend::saturation(Vec3 *rgb)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = rgb->m_data[0];
  fVar1 = rgb->m_data[1];
  fVar5 = (float)(~-(uint)(fVar1 <= fVar6) & (uint)fVar1 | -(uint)(fVar1 <= fVar6) & (uint)fVar6);
  fVar2 = rgb->m_data[2];
  uVar3 = -(uint)(fVar2 <= fVar5);
  fVar6 = (float)(~-(uint)(fVar6 <= fVar1) & (uint)fVar1 | (uint)fVar6 & -(uint)(fVar6 <= fVar1));
  uVar4 = -(uint)(fVar6 <= fVar2);
  return (float)(~uVar3 & (uint)fVar2 | uVar3 & (uint)fVar5) -
         (float)(~uVar4 & (uint)fVar2 | uVar4 & (uint)fVar6);
}

Assistant:

T						z			(void) const { DE_STATIC_ASSERT(Size >= 3); return m_data[2]; }